

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::check_string_to_number_format(char_t *string)

{
  char_t *string_local;
  bool local_1;
  
  string_local = string;
  while (((anonymous_namespace)::chartype_table[(byte)*string_local] & 8) != 0) {
    string_local = string_local + 1;
  }
  if (*string_local == '-') {
    string_local = string_local + 1;
  }
  if (*string_local == '\0') {
    local_1 = false;
  }
  else if ((((anonymous_namespace)::chartypex_table[(byte)*string_local] & 8) == 0) &&
          ((*string_local != '.' ||
           (((anonymous_namespace)::chartypex_table[(byte)string_local[1]] & 8) == 0)))) {
    local_1 = false;
  }
  else {
    while (((anonymous_namespace)::chartypex_table[(byte)*string_local] & 8) != 0) {
      string_local = string_local + 1;
    }
    if (*string_local == '.') {
      do {
        string_local = string_local + 1;
      } while (((anonymous_namespace)::chartypex_table[(byte)*string_local] & 8) != 0);
    }
    while (((anonymous_namespace)::chartype_table[(byte)*string_local] & 8) != 0) {
      string_local = string_local + 1;
    }
    local_1 = *string_local == '\0';
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool check_string_to_number_format(const char_t* string)
	{
		// parse leading whitespace
		while (PUGI_IMPL_IS_CHARTYPE(*string, ct_space)) ++string;

		// parse sign
		if (*string == '-') ++string;

		if (!*string) return false;

		// if there is no integer part, there should be a decimal part with at least one digit
		if (!PUGI_IMPL_IS_CHARTYPEX(string[0], ctx_digit) && (string[0] != '.' || !PUGI_IMPL_IS_CHARTYPEX(string[1], ctx_digit))) return false;

		// parse integer part
		while (PUGI_IMPL_IS_CHARTYPEX(*string, ctx_digit)) ++string;

		// parse decimal part
		if (*string == '.')
		{
			++string;

			while (PUGI_IMPL_IS_CHARTYPEX(*string, ctx_digit)) ++string;
		}

		// parse trailing whitespace
		while (PUGI_IMPL_IS_CHARTYPE(*string, ct_space)) ++string;

		return *string == 0;
	}